

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_xyz_normal(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *normal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  REF_DBL edge20 [3];
  REF_DBL edge10 [3];
  REF_DBL *normal_local;
  REF_DBL *xyz2_local;
  REF_DBL *xyz1_local;
  REF_DBL *xyz0_local;
  
  dVar1 = *xyz1;
  dVar2 = *xyz0;
  dVar3 = xyz1[1];
  dVar4 = xyz0[1];
  dVar5 = xyz1[2];
  dVar6 = xyz0[2];
  dVar7 = *xyz2;
  dVar8 = *xyz0;
  dVar9 = xyz2[1];
  dVar10 = xyz0[1];
  dVar11 = xyz2[2];
  dVar12 = xyz0[2];
  *normal = (dVar3 - dVar4) * (dVar11 - dVar12) + -((dVar5 - dVar6) * (dVar9 - dVar10));
  normal[1] = (dVar5 - dVar6) * (dVar7 - dVar8) + -((dVar1 - dVar2) * (dVar11 - dVar12));
  normal[2] = (dVar1 - dVar2) * (dVar9 - dVar10) + -((dVar3 - dVar4) * (dVar7 - dVar8));
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_node_xyz_normal(REF_DBL *xyz0, REF_DBL *xyz1,
                                              REF_DBL *xyz2, REF_DBL *normal) {
  REF_DBL edge10[3], edge20[3];

  edge10[0] = xyz1[0] - xyz0[0];
  edge10[1] = xyz1[1] - xyz0[1];
  edge10[2] = xyz1[2] - xyz0[2];

  edge20[0] = xyz2[0] - xyz0[0];
  edge20[1] = xyz2[1] - xyz0[1];
  edge20[2] = xyz2[2] - xyz0[2];

  ref_math_cross_product(edge10, edge20, normal);

  return REF_SUCCESS;
}